

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type_conflict3 __thiscall QList<int>::takeFirst(QList<int> *this)

{
  int **ppiVar1;
  qsizetype *pqVar2;
  value_type_conflict3 vVar3;
  iterator iVar4;
  
  iVar4 = begin(this);
  vVar3 = *iVar4.i;
  ppiVar1 = &(this->d).ptr;
  *ppiVar1 = *ppiVar1 + 1;
  pqVar2 = &(this->d).size;
  *pqVar2 = *pqVar2 + -1;
  return vVar3;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }